

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O1

void __thiscall
crnlib::dxt1_endpoint_optimizer::compute_pca
          (dxt1_endpoint_optimizer *this,vec3F *axis,vec3F_array *norm_colors,vec3F *def)

{
  float fVar1;
  float fVar2;
  float fVar3;
  uint i;
  uint uVar4;
  long lVar5;
  float *pfVar6;
  ulong uVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  
  if ((ulong)norm_colors->m_size == 0) {
    dVar10 = 0.0;
    dVar11 = 0.0;
    dVar12 = 0.0;
    dVar13 = 0.0;
    dVar14 = 0.0;
    dVar9 = 0.0;
  }
  else {
    pfVar6 = norm_colors->m_p->m_s + 2;
    dVar9 = 0.0;
    uVar7 = 0;
    dVar14 = 0.0;
    dVar13 = 0.0;
    dVar12 = 0.0;
    dVar11 = 0.0;
    dVar10 = 0.0;
    do {
      fVar1 = ((vec<3U,_float> *)(pfVar6 + -2))->m_s[0];
      fVar2 = pfVar6[-1];
      fVar3 = *pfVar6;
      uVar4 = (this->m_unique_colors).m_p[uVar7].m_weight;
      if (uVar4 < 2) {
        dVar18 = (double)(fVar1 * fVar1);
        dVar19 = (double)(fVar1 * fVar2);
        dVar16 = (double)(fVar1 * fVar3);
        dVar17 = (double)(fVar2 * fVar2);
        dVar20 = (double)(fVar2 * fVar3);
        dVar15 = (double)(fVar3 * fVar3);
      }
      else {
        dVar15 = (double)uVar4;
        dVar18 = (double)(fVar1 * fVar1) * dVar15;
        dVar19 = (double)(fVar1 * fVar2) * dVar15;
        dVar16 = (double)(fVar1 * fVar3) * dVar15;
        dVar17 = (double)(fVar2 * fVar2) * dVar15;
        dVar20 = (double)(fVar2 * fVar3) * dVar15;
        dVar15 = (double)(fVar3 * fVar3) * dVar15;
      }
      dVar14 = dVar14 + dVar19;
      dVar13 = dVar13 + dVar16;
      dVar12 = dVar12 + dVar17;
      dVar11 = dVar11 + dVar20;
      dVar9 = dVar9 + dVar18;
      dVar10 = dVar10 + dVar15;
      uVar7 = uVar7 + 1;
      pfVar6 = pfVar6 + 3;
    } while (norm_colors->m_size != uVar7);
  }
  dVar20 = 0.699999988079071;
  dVar15 = 0.8999999761581421;
  dVar18 = 1.0;
  uVar4 = 0;
  do {
    dVar17 = dVar20 * dVar13 + dVar15 * dVar9 + dVar14 * dVar18;
    dVar19 = dVar20 * dVar11 + dVar15 * dVar14 + dVar12 * dVar18;
    dVar21 = dVar20 * dVar10 + dVar15 * dVar13 + dVar11 * dVar18;
    dVar16 = ABS(dVar17);
    if (ABS(dVar17) <= ABS(dVar19)) {
      dVar16 = ABS(dVar19);
    }
    if (dVar16 <= ABS(dVar21)) {
      dVar16 = ABS(dVar21);
    }
    dVar22 = 1.0 / dVar16;
    if (1e-10 < dVar16) {
      dVar17 = dVar17 * dVar22;
      dVar19 = dVar19 * dVar22;
    }
    dVar16 = (double)(~-(ulong)(1e-10 < dVar16) & (ulong)dVar21 |
                     (ulong)(dVar22 * dVar21) & -(ulong)(1e-10 < dVar16));
  } while ((uVar4 < 3 ||
            1e-08 <= (dVar20 - dVar16) * (dVar20 - dVar16) +
                     (dVar18 - dVar19) * (dVar18 - dVar19) + (dVar15 - dVar17) * (dVar15 - dVar17))
          && (bVar8 = uVar4 != 7, dVar20 = dVar16, dVar15 = dVar17, dVar18 = dVar19,
             uVar4 = uVar4 + 1, bVar8));
  dVar9 = dVar16 * dVar16 + dVar17 * dVar17 + dVar19 * dVar19;
  if (1e-10 <= dVar9) {
    if (dVar9 < 0.0) {
      dVar9 = sqrt(dVar9);
    }
    else {
      dVar9 = SQRT(dVar9);
    }
    dVar9 = 1.0 / dVar9;
    axis->m_s[0] = (float)(dVar17 * dVar9);
    axis->m_s[1] = (float)(dVar19 * dVar9);
    axis->m_s[2] = (float)(dVar9 * dVar16);
  }
  else if (axis != def) {
    lVar5 = 0;
    do {
      axis->m_s[lVar5] = def->m_s[lVar5];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 3);
  }
  return;
}

Assistant:

void dxt1_endpoint_optimizer::compute_pca(vec3F& axis, const vec3F_array& norm_colors, const vec3F& def)
    {
        double cov[6] = { 0, 0, 0, 0, 0, 0 };
        for (uint i = 0; i < norm_colors.size(); i++)
        {
            const vec3F& v = norm_colors[i];
            float r = v[0];
            float g = v[1];
            float b = v[2];
            if (m_unique_colors[i].m_weight > 1)
            {
                const double weight = m_unique_colors[i].m_weight;
                cov[0] += r * r * weight;
                cov[1] += r * g * weight;
                cov[2] += r * b * weight;
                cov[3] += g * g * weight;
                cov[4] += g * b * weight;
                cov[5] += b * b * weight;
            }
            else
            {
                cov[0] += r * r;
                cov[1] += r * g;
                cov[2] += r * b;
                cov[3] += g * g;
                cov[4] += g * b;
                cov[5] += b * b;
            }
        }
        double vfr = .9f;
        double vfg = 1.0f;
        double vfb = .7f;
        for (uint iter = 0; iter < 8; iter++)
        {
            double r = vfr * cov[0] + vfg * cov[1] + vfb * cov[2];
            double g = vfr * cov[1] + vfg * cov[3] + vfb * cov[4];
            double b = vfr * cov[2] + vfg * cov[4] + vfb * cov[5];
            double m = math::maximum(fabs(r), fabs(g), fabs(b));
            if (m > 1e-10)
            {
                m = 1.0f / m;
                r *= m;
                g *= m;
                b *= m;
            }
            double delta = math::square(vfr - r) + math::square(vfg - g) + math::square(vfb - b);
            vfr = r;
            vfg = g;
            vfb = b;
            if ((iter > 2) && (delta < 1e-8))
            {
                break;
            }
        }
        double len = vfr * vfr + vfg * vfg + vfb * vfb;
        if (len < 1e-10)
        {
            axis = def;
        }
        else
        {
            len = 1.0f / sqrt(len);
            axis.set(static_cast<float>(vfr * len), static_cast<float>(vfg * len), static_cast<float>(vfb * len));
        }
    }